

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O1

void __thiscall gimage::View::setImage(View *this,ImageU8 *img)

{
  size_t sVar1;
  Camera *pCVar2;
  long lVar3;
  size_t __n;
  
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (&this->image,img->width,img->height,(long)img->depth);
  sVar1 = (this->image).n;
  __n = -sVar1;
  if (0 < (long)sVar1) {
    __n = sVar1;
  }
  memcpy((this->image).pixel,img->pixel,__n);
  pCVar2 = this->camera;
  if (((pCVar2 != (Camera *)0x0) && (pCVar2->width == 0)) && (pCVar2->height == 0)) {
    lVar3 = (this->image).height;
    pCVar2->width = (this->image).width;
    pCVar2->height = lVar3;
  }
  return;
}

Assistant:

void View::setImage(const ImageU8 &img)
{
  image=img;

  // set size of camera from images if neccessary

  if (camera != 0 && camera->getWidth() == 0 && camera->getHeight() == 0)
  {
    camera->setSize(image.getWidth(), image.getHeight());
  }
}